

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O3

Solution * Genetic::run(int max_iter)

{
  double dVar1;
  _List_node_base *p_Var2;
  undefined8 *puVar3;
  Solution *pSVar4;
  _List_node_base *p_Var5;
  long lVar6;
  ostream *poVar7;
  _List_node_base *p_Var8;
  iterator __end2;
  const_iterator cVar9;
  undefined8 *puVar10;
  const_iterator __first;
  list<std::pair<Solution_*,_Solution_*>,_std::allocator<std::pair<Solution_*,_Solution_*>_>_>
  parents;
  undefined8 *local_48 [3];
  
  generate_population();
  std::__cxx11::list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
  ::sort<solutions_comparator>(&solutions_abi_cxx11_);
  while( true ) {
    dVar1 = max_weight;
    p_Var5 = solutions_abi_cxx11_.
             super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    ticket_max = 0.0;
    p_Var8 = solutions_abi_cxx11_.
             super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (solutions_abi_cxx11_.
        super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&solutions_abi_cxx11_)
    {
      do {
        p_Var2 = (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                    *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        ticket_max = ticket_max + (dVar1 - (double)p_Var8[1]._M_next[1]._M_prev);
        p_Var8[1]._M_prev = (_List_node_base *)ticket_max;
        p_Var8 = p_Var2;
      } while (p_Var2 != (_List_node_base *)&solutions_abi_cxx11_);
    }
    if ((int)ticket_max == 0) break;
    select_parents_abi_cxx11_();
    for (puVar10 = local_48[0]; (undefined8 **)puVar10 != local_48; puVar10 = (undefined8 *)*puVar10
        ) {
      pSVar4 = generate_child((Solution *)puVar10[2],(Solution *)puVar10[3]);
      p_Var5 = (_List_node_base *)operator_new(0x20);
      p_Var5[1]._M_next = (_List_node_base *)pSVar4;
      p_Var5[1]._M_prev = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      solutions_abi_cxx11_.
      super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
      ._M_impl._M_node._M_size =
           solutions_abi_cxx11_.
           super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
           ._M_impl._M_node._M_size + 1;
    }
    max_weight = 0.0;
    for (p_Var5 = solutions_abi_cxx11_.
                  super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var5 != (_List_node_base *)&solutions_abi_cxx11_;
        p_Var5 = (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                    *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      pSVar4 = (Solution *)p_Var5[1]._M_next;
      Solution::mutate(pSVar4);
      dVar1 = pSVar4->weight;
      if (max_weight < dVar1) {
        max_weight = dVar1;
      }
    }
    std::__cxx11::
    list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::
    sort<solutions_comparator>(&solutions_abi_cxx11_);
    lVar6 = (long)population_limit;
    __first._M_node =
         solutions_abi_cxx11_.
         super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (lVar6 < 1) {
      if (population_limit != 0) {
        do {
          __first._M_node = (__first._M_node)->_M_prev;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0);
      }
    }
    else {
      do {
        __first._M_node = (__first._M_node)->_M_next;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    cVar9._M_node = __first._M_node;
    if (__first._M_node != (_List_node_base *)&solutions_abi_cxx11_) {
      do {
        pSVar4 = (Solution *)cVar9._M_node[1]._M_next;
        if (pSVar4 != (Solution *)0x0) {
          Solution::~Solution(pSVar4);
        }
        operator_delete(pSVar4);
        cVar9._M_node =
             (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                *)&(cVar9._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (cVar9._M_node != (_List_node_base *)&solutions_abi_cxx11_);
    }
    std::__cxx11::
    list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>::erase
              (&solutions_abi_cxx11_,__first,(const_iterator)0x1216f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Genetic iteration, best solution: ",0x22);
    poVar7 = std::ostream::_M_insert<double>
                       ((double)solutions_abi_cxx11_.
                                super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                                ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_prev
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    puVar10 = local_48[0];
    if ((undefined8 **)local_48[0] != local_48) {
      do {
        puVar3 = (undefined8 *)*puVar10;
        operator_delete(puVar10);
        puVar10 = puVar3;
      } while ((undefined8 **)puVar3 != local_48);
    }
  }
  return (Solution *)p_Var5[1]._M_next;
}

Assistant:

Solution* Genetic::run(int max_iter)
{
	generate_population();
	solutions.sort(solutions_comparator());
	while (true || max_iter-- > 0)
	{
		if (!avaliate_population())
		{
			return (*solutions.begin()).first;
		}
		std::list<std::pair<Solution*, Solution*>> parents = select_parents();

		//Generate childs and add to solutions pool
		for (auto parent : parents)
		{
			solutions.push_back(std::pair<Solution*, double>(generate_child(parent.first, parent.second), 0));
		}

		//Mutate solutions
		max_weight = 0;
		for (auto solution : solutions)
		{
			solution.first->mutate();

			if (solution.first->weight > max_weight)
				max_weight = solution.first->weight;
		}


		//Kill the worst		
		solutions.sort(solutions_comparator());
		auto it = solutions.begin();
		std::advance(it, population_limit);

		auto it2 = it;
		for (; it2 != solutions.end(); ++it2)
			delete (*it2).first;

		solutions.erase(it, solutions.end());

		std::cout << "Genetic iteration, best solution: " << (*solutions.begin()).first->weight << "\n";
	}
	return solutions.begin()->first;
}